

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<true>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,long *next)

{
  undefined8 uVar1;
  char *pcVar2;
  bool bVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  difference_type __d;
  
  uVar1 = *(undefined8 *)(this + 0x30);
  pcVar2 = (state->cur_)._M_current;
  for (uVar7 = 0; uVar7 < *(uint *)(this + 0x2c); uVar7 = uVar7 + 1) {
    bVar3 = matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>
            ::match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>
                        *)this,state);
    if (!bVar3) break;
  }
  if (this[0x38] ==
      (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<true>>
       )0x1) {
    pcVar6 = pcVar2 + ((state->end_)._M_current != pcVar2);
    if (uVar7 < *(uint *)(this + 0x2c)) {
      pcVar6 = (state->cur_)._M_current;
    }
    pcVar5 = pcVar2 + ((state->end_)._M_current != pcVar2);
    if (uVar7 != 0) {
      pcVar5 = pcVar6;
    }
    (state->next_search_)._M_current = pcVar5;
  }
  if (uVar7 < *(uint *)(this + 0x28)) {
LAB_00126db0:
    (state->cur_)._M_current = pcVar2;
    bVar3 = false;
  }
  else {
    while( true ) {
      cVar4 = (**(code **)(*next + 0x10))(next,state);
      if (cVar4 != '\0') break;
      if (uVar7 == *(uint *)(this + 0x28)) goto LAB_00126db0;
      uVar7 = uVar7 - 1;
      (state->cur_)._M_current = (state->cur_)._M_current + -(int)uVar1;
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_slow_tag) const
        {
            int const diff = -static_cast<int>(Xpr::width == unknown_width::value ? this->width_ : Xpr::width);
            unsigned int matches = 0;
            BidiIter const tmp = state.cur_;

            // greedily match as much as we can
            while(matches < this->max_ && this->xpr_.match(state))
            {
                ++matches;
            }

            // If this repeater is at the front of the pattern, note
            // how much of the input we consumed so that a repeated search
            // doesn't have to cover the same ground again.
            if(this->leading_)
            {
                state.next_search_ = (matches && matches < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            if(this->min_ > matches)
            {
                state.cur_ = tmp;
                return false;
            }

            // try matching the rest of the pattern, and back off if necessary
            for(; ; --matches, std::advance(state.cur_, diff))
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(this->min_ == matches)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }